

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionCodeGenJitTimeData.cpp
# Opt level: O2

FunctionCodeGenJitTimeData * __thiscall
Js::FunctionCodeGenJitTimeData::AddLdFldInlinee
          (FunctionCodeGenJitTimeData *this,Recycler *recycler,InlineCacheIndex inlineCacheIndex,
          FunctionInfo *inlinee)

{
  Type *this_00;
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  FunctionBody *pFVar6;
  Recycler *this_01;
  WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *pWVar7;
  FunctionCodeGenJitTimeData *ptr;
  undefined1 local_60 [8];
  TrackAllocData data;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xa5,"(recycler)","recycler");
    if (!bVar3) goto LAB_00414a3c;
    *puVar5 = 0;
  }
  pFVar6 = GetFunctionBody(this);
  if (pFVar6 == (FunctionBody *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xa7,"(functionBody)","functionBody");
    if (!bVar3) goto LAB_00414a3c;
    *puVar5 = 0;
  }
  pFVar6 = GetFunctionBody(this);
  uVar4 = FunctionBody::GetInlineCacheCount(pFVar6);
  if (uVar4 <= inlineCacheIndex) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xa8,
                                "(inlineCacheIndex < GetFunctionBody()->GetInlineCacheCount())",
                                "inlineCacheIndex < GetFunctionBody()->GetInlineCacheCount()");
    if (!bVar3) goto LAB_00414a3c;
    *puVar5 = 0;
  }
  if (inlinee == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xa9,"(inlinee)","inlinee");
    if (!bVar3) goto LAB_00414a3c;
    *puVar5 = 0;
  }
  this_00 = &this->ldFldInlinees;
  if ((this->ldFldInlinees).ptr == (WriteBarrierPtr<Js::FunctionCodeGenJitTimeData> *)0x0) {
    pFVar6 = GetFunctionBody(this);
    uVar4 = FunctionBody::GetInlineCacheCount(pFVar6);
    data.plusSize = (size_t)uVar4;
    local_60 = (undefined1  [8])&Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_d3658c;
    data.filename._0_4_ = 0xad;
    this_01 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_60);
    data._32_8_ = recycler;
    pFVar6 = GetFunctionBody(this);
    uVar4 = FunctionBody::GetInlineCacheCount(pFVar6);
    recycler = (Recycler *)data._32_8_;
    pWVar7 = Memory::
             AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>,false>
                       ((Memory *)this_01,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)uVar4);
    Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>_>::
    WriteBarrierSet(this_00,pWVar7);
  }
  ptr = New(recycler,inlinee,(EntryPointInfo *)0x0,true);
  pWVar7 = this_00->ptr;
  if (pWVar7[inlineCacheIndex].ptr != (FunctionCodeGenJitTimeData *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FunctionCodeGenJitTimeData.cpp"
                                ,0xb1,"(!ldFldInlinees[inlineCacheIndex])",
                                "!ldFldInlinees[inlineCacheIndex]");
    if (!bVar3) {
LAB_00414a3c:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
    pWVar7 = this_00->ptr;
  }
  Memory::WriteBarrierPtr<Js::FunctionCodeGenJitTimeData>::WriteBarrierSet
            (pWVar7 + inlineCacheIndex,ptr);
  pTVar1 = &this->ldFldInlineeCount;
  *pTVar1 = *pTVar1 + 1;
  if (*pTVar1 != 0) {
    return ptr;
  }
  Throw::OutOfMemory();
}

Assistant:

FunctionCodeGenJitTimeData *FunctionCodeGenJitTimeData::AddLdFldInlinee(
        Recycler *const recycler,
        const InlineCacheIndex inlineCacheIndex,
        FunctionInfo *const inlinee)
    {
        Assert(recycler);
        const auto functionBody = GetFunctionBody();
        Assert(functionBody);
        Assert(inlineCacheIndex < GetFunctionBody()->GetInlineCacheCount());
        Assert(inlinee);

        if (!ldFldInlinees)
        {
            ldFldInlinees = RecyclerNewArrayZ(recycler, Field(FunctionCodeGenJitTimeData*), GetFunctionBody()->GetInlineCacheCount());
        }

        const auto inlineeData = FunctionCodeGenJitTimeData::New(recycler, inlinee, nullptr);
        Assert(!ldFldInlinees[inlineCacheIndex]);
        ldFldInlinees[inlineCacheIndex] = inlineeData;
        if (++ldFldInlineeCount == 0)
        {
            Js::Throw::OutOfMemory();
        }
        return inlineeData;
    }